

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_contract_request_format_json(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  size_t sVar1;
  la_vstring *vstr;
  long in_RDX;
  undefined8 in_RDI;
  la_adsc_tag_t *t;
  la_list *ptr;
  size_t len;
  la_adsc_req_t *r;
  char *in_stack_ffffffffffffffc8;
  char *key;
  la_vstring *in_stack_ffffffffffffffd0;
  
  la_json_append_int64(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x171fab);
  sVar1 = la_list_length((la_list *)in_stack_ffffffffffffffd0);
  if (sVar1 != 0) {
    la_json_array_start(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    vstr = *(la_vstring **)(in_RDX + 8);
    while ((((vstr != (la_vstring *)0x0 && (key = vstr->str, *(long *)(key + 8) != 0)) &&
            (*(long *)(*(long *)(key + 8) + 0x20) != 0)) && (*(long *)(*(long *)(key + 8) + 8) != 0)
           )) {
      la_json_object_start(vstr,key);
      la_json_object_start(vstr,key);
      (**(code **)(*(long *)(key + 8) + 0x20))(in_RDI,0,*(undefined8 *)(key + 0x10));
      la_json_object_end((la_vstring *)0x172086);
      la_json_object_end((la_vstring *)0x172093);
      vstr = (la_vstring *)la_list_next((la_list *)vstr);
    }
    la_json_array_end((la_vstring *)0x1720b4);
  }
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_contract_request_format_json) {
	LA_UNUSED(label);
	la_adsc_req_t const *r = data;
	la_json_append_int64(ctx->vstr, "contract_num", r->contract_num);

	size_t len = la_list_length(r->req_tag_list);
	if(len == 0) {
		return;
	}
	la_json_array_start(ctx->vstr, "groups");
	for(la_list *ptr = r->req_tag_list; ptr != NULL; ptr = la_list_next(ptr)) {
		la_adsc_tag_t *t = ptr->data;
		if(t->type == NULL || t->type->format_json == NULL || t->type->json_key == NULL) {
			break;
		}
		la_json_object_start(ctx->vstr, NULL);
		la_json_object_start(ctx->vstr, t->type->json_key);
		t->type->format_json(ctx, NULL, t->data);
		la_json_object_end(ctx->vstr);
		la_json_object_end(ctx->vstr);
	}
	la_json_array_end(ctx->vstr);
}